

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

void curses_update_status(nh_player_info *pi)

{
  nh_player_info *pi_local;
  
  curses_update_status_silent(pi);
  if (player.x != 0) {
    if (settings.classic_status == '\0') {
      draw_status_lines(&player,ui_flags.status3);
    }
    else {
      classic_status(&player,ui_flags.status3);
    }
    wmove(mapwin,player.y,player.x + -1);
    if ((ui_flags.draw_frame != '\0') && (settings.frame_hp_color != '\0')) {
      redraw_frame();
    }
    wnoutrefresh(statuswin);
  }
  return;
}

Assistant:

void curses_update_status(struct nh_player_info *pi)
{
    curses_update_status_silent(pi);

    if (player.x == 0)
	return; /* called before the game is running */

    if (settings.classic_status)
	classic_status(&player, ui_flags.status3);
    else
	draw_status_lines(&player, ui_flags.status3);

    /* prevent the cursor from flickering in the status line */
    wmove(mapwin, player.y, player.x - 1);

    /* if HP changes, frame color may change */
    if (ui_flags.draw_frame && settings.frame_hp_color)
	redraw_frame();

    wnoutrefresh(statuswin);
}